

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O3

void pqdownheap(deflate_state *s,ct_data *tree,int k)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  
  iVar1 = s->heap[(uint)k];
  uVar2 = k * 2;
  iVar4 = s->heap_len;
  if ((int)uVar2 <= iVar4) {
    do {
      uVar3 = uVar2;
      if ((int)uVar2 < iVar4) {
        uVar6 = uVar2 | 1;
        lVar5 = (long)(int)uVar2;
        if (tree[s->heap[(int)uVar6]].fc.freq < tree[s->heap[lVar5]].fc.freq) {
LAB_0058b486:
          lVar5 = (long)(int)uVar6;
          uVar3 = uVar6;
        }
        else {
          if (tree[s->heap[(int)uVar6]].fc.freq != tree[s->heap[lVar5]].fc.freq) goto LAB_0058b491;
          if (s->depth[s->heap[(int)uVar6]] <= s->depth[s->heap[lVar5]]) goto LAB_0058b486;
        }
      }
      else {
LAB_0058b491:
        lVar5 = (long)(int)uVar2;
      }
      iVar4 = s->heap[lVar5];
      if ((tree[iVar1].fc.freq < tree[iVar4].fc.freq) ||
         ((tree[iVar1].fc.freq == tree[iVar4].fc.freq && (s->depth[iVar1] <= s->depth[iVar4]))))
      break;
      s->heap[k] = iVar4;
      uVar2 = uVar3 * 2;
      iVar4 = s->heap_len;
      k = uVar3;
    } while ((int)uVar2 <= iVar4);
  }
  s->heap[k] = iVar1;
  return;
}

Assistant:

local void pqdownheap(s, tree, k)
    deflate_state *s;
    ct_data *tree;  /* the tree to restore */
    int k;               /* node to move down */
{
    int v = s->heap[k];
    int j = k << 1;  /* left son of k */
    while (j <= s->heap_len) {
        /* Set j to the smallest of the two sons: */
        if (j < s->heap_len &&
            smaller(tree, s->heap[j+1], s->heap[j], s->depth)) {
            j++;
        }
        /* Exit if v is smaller than both sons */
        if (smaller(tree, v, s->heap[j], s->depth)) break;

        /* Exchange v with the smallest son */
        s->heap[k] = s->heap[j];  k = j;

        /* And continue down the tree, setting j to the left son of k */
        j <<= 1;
    }
    s->heap[k] = v;
}